

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DatabaseEngine.cpp
# Opt level: O3

impl_schema_type *
PrepareSchema(impl_schema_type *__return_storage_ptr__,api_schema_type *raw_schema)

{
  mapped_type mVar1;
  mapped_type *pmVar2;
  _Base_ptr p_Var3;
  _Rb_tree_header *p_Var4;
  key_type local_58;
  _Rb_tree_color local_38;
  
  p_Var4 = &(__return_storage_ptr__->_M_t)._M_impl.super__Rb_tree_header;
  (__return_storage_ptr__->_M_t)._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  (__return_storage_ptr__->_M_t)._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  (__return_storage_ptr__->_M_t)._M_impl.super__Rb_tree_header._M_header._M_left =
       &p_Var4->_M_header;
  (__return_storage_ptr__->_M_t)._M_impl.super__Rb_tree_header._M_header._M_right =
       &p_Var4->_M_header;
  (__return_storage_ptr__->_M_t)._M_impl.super__Rb_tree_header._M_node_count = 0;
  p_Var3 = (raw_schema->_M_t)._M_impl.super__Rb_tree_header._M_header._M_left;
  p_Var4 = &(raw_schema->_M_t)._M_impl.super__Rb_tree_header;
  if ((_Rb_tree_header *)p_Var3 != p_Var4) {
    do {
      local_58._M_dataplus._M_p = (pointer)&local_58.field_2;
      std::__cxx11::string::_M_construct<char*>
                ((string *)&local_58,*(long *)(p_Var3 + 1),
                 (long)&(p_Var3[1]._M_parent)->_M_color + *(long *)(p_Var3 + 1));
      local_38 = p_Var3[2]._M_color;
      if ((ulong)local_38 < 4) {
        mVar1 = *(mapped_type *)(&DAT_00148c00 + (ulong)local_38 * 4);
        pmVar2 = std::
                 map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_database::DataType,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_database::DataType>_>_>
                 ::operator[](__return_storage_ptr__,&local_58);
        *pmVar2 = mVar1;
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_58._M_dataplus._M_p != &local_58.field_2) {
        operator_delete(local_58._M_dataplus._M_p,local_58.field_2._M_allocated_capacity + 1);
      }
      p_Var3 = (_Base_ptr)std::_Rb_tree_increment(p_Var3);
    } while ((_Rb_tree_header *)p_Var3 != p_Var4);
  }
  return __return_storage_ptr__;
}

Assistant:

database::impl_schema_type PrepareSchema(const database::api_schema_type& raw_schema)
{
  database::impl_schema_type schema;
  std::for_each(raw_schema.begin(),raw_schema.end(),[&](auto pair) {
    switch (pair.second)
    {
      case database::integer: schema[pair.first] = database::numeric; break;
      case database::string: schema[pair.first] = database::non_numeric; break;
      case database::boolean: schema[pair.first] = database::non_numeric; break;
      case database::date: schema[pair.first] = database::numeric; break;
      default: break;
    }
  });
  return schema;
}